

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
          (SmallVectorBase<slang::parsing::Token> *this,Token *args)

{
  size_type sVar1;
  ulong uVar2;
  undefined8 *puVar3;
  Info *pIVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  pointer pTVar8;
  pointer pTVar9;
  pointer pTVar10;
  pointer pTVar11;
  EVP_PKEY_CTX *pEVar12;
  EVP_PKEY_CTX *ctx;
  long lVar13;
  pointer pTVar14;
  
  pTVar14 = this->data_ + this->len;
  if (this->len != this->cap) {
    uVar5 = args->field_0x2;
    NVar6.raw = (args->numFlags).raw;
    uVar7 = args->rawLen;
    pIVar4 = args->info;
    pTVar14->kind = args->kind;
    pTVar14->field_0x2 = uVar5;
    pTVar14->numFlags = (NumericTokenFlags)NVar6.raw;
    pTVar14->rawLen = uVar7;
    pTVar14->info = pIVar4;
    sVar1 = this->len;
    this->len = sVar1 + 1;
    return this->data_ + sVar1;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar12 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar12 < ctx) {
    pEVar12 = ctx;
  }
  if (0x7ffffffffffffff - uVar2 < uVar2) {
    pEVar12 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar13 = (long)pTVar14 - (long)this->data_;
  pTVar8 = (pointer)operator_new((long)pEVar12 << 4);
  pIVar4 = args->info;
  *(undefined8 *)((long)pTVar8 + lVar13) = *(undefined8 *)args;
  ((undefined8 *)((long)pTVar8 + lVar13))[1] = pIVar4;
  pTVar11 = this->data_;
  pTVar9 = pTVar11 + this->len;
  pTVar10 = pTVar8;
  if (pTVar9 == pTVar14) {
    for (; pTVar11 != pTVar14; pTVar11 = pTVar11 + 1) {
      uVar5 = pTVar11->field_0x2;
      NVar6.raw = (pTVar11->numFlags).raw;
      uVar7 = pTVar11->rawLen;
      pIVar4 = pTVar11->info;
      pTVar10->kind = pTVar11->kind;
      pTVar10->field_0x2 = uVar5;
      pTVar10->numFlags = (NumericTokenFlags)NVar6.raw;
      pTVar10->rawLen = uVar7;
      pTVar10->info = pIVar4;
      pTVar10 = pTVar10 + 1;
    }
  }
  else {
    for (; pTVar11 != pTVar14; pTVar11 = pTVar11 + 1) {
      uVar5 = pTVar11->field_0x2;
      NVar6.raw = (pTVar11->numFlags).raw;
      uVar7 = pTVar11->rawLen;
      pIVar4 = pTVar11->info;
      pTVar10->kind = pTVar11->kind;
      pTVar10->field_0x2 = uVar5;
      pTVar10->numFlags = (NumericTokenFlags)NVar6.raw;
      pTVar10->rawLen = uVar7;
      pTVar10->info = pIVar4;
      pTVar10 = pTVar10 + 1;
    }
    puVar3 = (undefined8 *)(lVar13 + (long)pTVar8);
    for (; pTVar14 != pTVar9; pTVar14 = pTVar14 + 1) {
      pIVar4 = pTVar14->info;
      puVar3[2] = *(undefined8 *)pTVar14;
      puVar3[3] = pIVar4;
      puVar3 = puVar3 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar12;
  this->data_ = pTVar8;
  return (reference)((long)pTVar8 + lVar13);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }